

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O2

string * __thiscall
CLI::getSubCommand(string *__return_storage_ptr__,CLI *this,
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *subCommands,string *defaultCommand)

{
  string sStack_38;
  
  findSubCommand(&sStack_38,this,subCommands);
  if (sStack_38._M_string_length != 0) {
    defaultCommand = &sStack_38;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultCommand);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CLI::getSubCommand(const std::set<std::string>& subCommands, const std::string& defaultCommand) {
  const auto& subCommand = findSubCommand (subCommands);

  return subCommand.empty () ? defaultCommand : subCommand;
}